

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_function.hpp
# Opt level: O2

AggregateFunction * __thiscall
duckdb::UDFWrapper::
CreateAggregateFunction<duckdb::UDFCovarPopOperation,duckdb::udf_covar_state_t,double,double,double>
          (AggregateFunction *__return_storage_ptr__,UDFWrapper *this,string *name,
          LogicalType *ret_type,LogicalType *input_type_a,LogicalType *input_type_b)

{
  bool bVar1;
  runtime_error *this_00;
  
  bVar1 = TypesMatch<double>((LogicalType *)name);
  if (bVar1) {
    bVar1 = TypesMatch<double>(ret_type);
    if (bVar1) {
      bVar1 = TypesMatch<double>(input_type_a);
      if (bVar1) {
        CreateBinaryAggregateFunction<duckdb::UDFCovarPopOperation,duckdb::udf_covar_state_t,double,double,double>
                  (__return_storage_ptr__,this,name,ret_type,input_type_a,input_type_b);
        return __return_storage_ptr__;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"The second input argument don\'t match!");
    }
    else {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"The first input argument don\'t match!");
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"The return argument don\'t match!");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline static AggregateFunction CreateAggregateFunction(const string &name, const LogicalType &ret_type,
	                                                        const LogicalType &input_type_a,
	                                                        const LogicalType &input_type_b) {
		if (!TypesMatch<TR>(ret_type)) { // LCOV_EXCL_START
			throw std::runtime_error("The return argument don't match!");
		}

		if (!TypesMatch<TA>(input_type_a)) {
			throw std::runtime_error("The first input argument don't match!");
		}

		if (!TypesMatch<TB>(input_type_b)) {
			throw std::runtime_error("The second input argument don't match!");
		} // LCOV_EXCL_STOP

		return CreateBinaryAggregateFunction<UDF_OP, STATE, TR, TA, TB>(name, ret_type, input_type_a, input_type_b);
	}